

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcmarker.c
# Opt level: O0

void emit_pseudo_sos(j_compress_ptr cinfo)

{
  undefined8 in_RDI;
  JPEG_MARKER mark;
  
  mark = (JPEG_MARKER)((ulong)in_RDI >> 0x20);
  emit_marker(cinfo,mark);
  emit_2bytes(cinfo,mark);
  emit_byte(cinfo,mark);
  emit_byte(cinfo,mark);
  emit_byte(cinfo,mark);
  emit_byte(cinfo,mark);
  return;
}

Assistant:

LOCAL(void)
emit_pseudo_sos (j_compress_ptr cinfo)
/* Emit a pseudo SOS marker */
{
  emit_marker(cinfo, M_SOS);
  
  emit_2bytes(cinfo, 2 + 1 + 3); /* length */
  
  emit_byte(cinfo, 0); /* Ns */

  emit_byte(cinfo, 0); /* Ss */
  emit_byte(cinfo, cinfo->block_size * cinfo->block_size - 1); /* Se */
  emit_byte(cinfo, 0); /* Ah/Al */
}